

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WorldCoordinates.cpp
# Opt level: O0

void __thiscall
KDIS::DATA_TYPE::WorldCoordinates::Encode(WorldCoordinates *this,KDataStream *stream)

{
  KDataStream *pKVar1;
  KDataStream *stream_local;
  WorldCoordinates *this_local;
  
  pKVar1 = KDataStream::operator<<(stream,(double)this->m_f64X);
  pKVar1 = KDataStream::operator<<(pKVar1,(double)this->m_f64Y);
  KDataStream::operator<<(pKVar1,(double)this->m_f64Z);
  return;
}

Assistant:

void WorldCoordinates::Encode( KDataStream & stream ) const
{
    stream << m_f64X
           << m_f64Y
           << m_f64Z;
}